

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5VocabBestIndexMethod(sqlite3_vtab *pUnused,sqlite3_index_info *pInfo)

{
  sqlite3_index_constraint *psVar1;
  sqlite3_index_constraint *p;
  int nArg;
  int idxNum;
  int iTermLe;
  int iTermGe;
  int iTermEq;
  int i;
  sqlite3_index_info *pInfo_local;
  sqlite3_vtab *pUnused_local;
  
  iTermLe = -1;
  idxNum = -1;
  nArg = -1;
  p._4_4_ = 0;
  for (iTermGe = 0; iTermGe < pInfo->nConstraint; iTermGe = iTermGe + 1) {
    psVar1 = pInfo->aConstraint + iTermGe;
    if ((psVar1->usable != '\0') && (psVar1->iColumn == 0)) {
      if (psVar1->op == '\x02') {
        iTermLe = iTermGe;
      }
      if (psVar1->op == '\b') {
        nArg = iTermGe;
      }
      if (psVar1->op == '\x10') {
        nArg = iTermGe;
      }
      if (psVar1->op == ' ') {
        idxNum = iTermGe;
      }
      if (psVar1->op == '\x04') {
        idxNum = iTermGe;
      }
    }
  }
  if (iTermLe < 0) {
    pInfo->estimatedCost = 1000000.0;
    if (-1 < idxNum) {
      p._4_4_ = 2;
      pInfo->aConstraintUsage[idxNum].argvIndex = 1;
      pInfo->estimatedCost = pInfo->estimatedCost / 2.0;
    }
    p._0_4_ = (uint)(-1 < idxNum);
    if (-1 < nArg) {
      p._4_4_ = p._4_4_ | 4;
      pInfo->aConstraintUsage[nArg].argvIndex = (uint)p + 1;
      pInfo->estimatedCost = pInfo->estimatedCost / 2.0;
    }
  }
  else {
    p._4_4_ = 1;
    pInfo->aConstraintUsage[iTermLe].argvIndex = 1;
    pInfo->estimatedCost = 100.0;
  }
  if (((pInfo->nOrderBy == 1) && (pInfo->aOrderBy->iColumn == 0)) && (pInfo->aOrderBy->desc == '\0')
     ) {
    pInfo->orderByConsumed = 1;
  }
  pInfo->idxNum = p._4_4_;
  return 0;
}

Assistant:

static int fts5VocabBestIndexMethod(
  sqlite3_vtab *pUnused,
  sqlite3_index_info *pInfo
){
  int i;
  int iTermEq = -1;
  int iTermGe = -1;
  int iTermLe = -1;
  int idxNum = 0;
  int nArg = 0;

  UNUSED_PARAM(pUnused);

  for(i=0; i<pInfo->nConstraint; i++){
    struct sqlite3_index_constraint *p = &pInfo->aConstraint[i];
    if( p->usable==0 ) continue;
    if( p->iColumn==0 ){          /* term column */
      if( p->op==SQLITE_INDEX_CONSTRAINT_EQ ) iTermEq = i;
      if( p->op==SQLITE_INDEX_CONSTRAINT_LE ) iTermLe = i;
      if( p->op==SQLITE_INDEX_CONSTRAINT_LT ) iTermLe = i;
      if( p->op==SQLITE_INDEX_CONSTRAINT_GE ) iTermGe = i;
      if( p->op==SQLITE_INDEX_CONSTRAINT_GT ) iTermGe = i;
    }
  }

  if( iTermEq>=0 ){
    idxNum |= FTS5_VOCAB_TERM_EQ;
    pInfo->aConstraintUsage[iTermEq].argvIndex = ++nArg;
    pInfo->estimatedCost = 100;
  }else{
    pInfo->estimatedCost = 1000000;
    if( iTermGe>=0 ){
      idxNum |= FTS5_VOCAB_TERM_GE;
      pInfo->aConstraintUsage[iTermGe].argvIndex = ++nArg;
      pInfo->estimatedCost = pInfo->estimatedCost / 2;
    }
    if( iTermLe>=0 ){
      idxNum |= FTS5_VOCAB_TERM_LE;
      pInfo->aConstraintUsage[iTermLe].argvIndex = ++nArg;
      pInfo->estimatedCost = pInfo->estimatedCost / 2;
    }
  }

  /* This virtual table always delivers results in ascending order of
  ** the "term" column (column 0). So if the user has requested this
  ** specifically - "ORDER BY term" or "ORDER BY term ASC" - set the
  ** sqlite3_index_info.orderByConsumed flag to tell the core the results
  ** are already in sorted order.  */
  if( pInfo->nOrderBy==1 
   && pInfo->aOrderBy[0].iColumn==0 
   && pInfo->aOrderBy[0].desc==0
  ){
    pInfo->orderByConsumed = 1;
  }

  pInfo->idxNum = idxNum;
  return SQLITE_OK;
}